

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O3

void __thiscall
anon_unknown.dwarf_ca576d::Target::AddBacktrace(Target *this,Value *object,cmListFileBacktrace *bt)

{
  bool bVar1;
  Value *this_00;
  ArrayIndex backtrace;
  UInt local_34;
  Value local_30;
  
  bVar1 = BacktraceData::Add(&this->Backtraces,bt,&local_34);
  if (bVar1) {
    Json::Value::Value(&local_30,local_34);
    this_00 = Json::Value::operator[](object,"backtrace");
    Json::Value::operator=(this_00,&local_30);
    Json::Value::~Value(&local_30);
  }
  return;
}

Assistant:

void Target::AddBacktrace(Json::Value& object, cmListFileBacktrace const& bt)
{
  Json::ArrayIndex backtrace;
  if (this->Backtraces.Add(bt, backtrace)) {
    object["backtrace"] = backtrace;
  }
}